

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summaryindex.cpp
# Opt level: O3

void summaryindex::doit(string *subfolder)

{
  int iVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  FILE *pFVar5;
  _Rb_tree_node_base *p_Var6;
  undefined8 extraout_RAX;
  _Rb_tree_color _Var7;
  _Base_ptr p_Var8;
  DIR *pDVar9;
  string *psVar10;
  _Self __tmp;
  pointer pbVar11;
  string s2;
  string filename;
  string path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  summary_id_file_id_to_offset;
  vector<int,_std::allocator<int>_> event_ids;
  string local_f8;
  value_type local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  undefined1 local_78 [16];
  _Base_ptr local_68;
  _Rb_tree_node_base *local_60;
  _Rb_tree_node_base *local_58;
  size_t local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  psVar10 = &local_f8;
  std::operator+(&local_b8,"work/",subfolder);
  std::__cxx11::string::substr((ulong)local_78,(ulong)&local_b8);
  iVar1 = std::__cxx11::string::compare(local_78);
  pDVar9 = (DIR *)&local_68;
  if ((DIR *)local_78._0_8_ != pDVar9) {
    operator_delete((void *)local_78._0_8_);
  }
  if (iVar1 != 0) {
    local_78._0_8_ = pDVar9;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    std::__cxx11::string::append(local_78);
    std::__cxx11::string::operator=((string *)&local_b8,(string *)local_78);
    if ((DIR *)local_78._0_8_ != pDVar9) {
      operator_delete((void *)local_78._0_8_);
    }
  }
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = 0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = (_Rb_tree_node_base *)(local_78 + 8);
  local_78._8_4_ = _S_red;
  local_68 = (_Base_ptr)0x0;
  local_50 = 0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_58 = local_60;
  __dirp = opendir(local_b8._M_dataplus._M_p);
  if (__dirp == (DIR *)0x0) {
    doit((summaryindex *)&local_b8);
LAB_00102ccd:
    doit((summaryindex *)&local_d8);
  }
  else {
    while (pdVar3 = readdir(__dirp), pdVar3 != (dirent *)0x0) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      sVar4 = strlen(pdVar3->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,pdVar3->d_name,pdVar3->d_name + sVar4);
      if (4 < local_d8._M_string_length) {
        std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_d8);
        iVar2 = std::__cxx11::string::compare((char *)&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        if (iVar2 == 0) {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,local_b8._M_dataplus._M_p,
                     local_b8._M_dataplus._M_p + local_b8._M_string_length);
          std::__cxx11::string::append((char *)&local_f8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_98,&local_d8);
          indexevents(&local_f8,&local_48,
                      (map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                       *)local_78,iVar1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          iVar1 = iVar1 + 1;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
    }
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    std::__cxx11::string::append((char *)&local_d8);
    pFVar5 = fopen(local_d8._M_dataplus._M_p,"wb");
    pDVar9 = __dirp;
    if (pFVar5 == (FILE *)0x0) goto LAB_00102ccd;
    if (local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __dirp = (DIR *)0x104166;
      pbVar11 = local_98.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        fprintf(pFVar5,"%s\n",(pbVar11->_M_dataplus)._M_p);
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 !=
               local_98.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    fclose(pFVar5);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    std::__cxx11::string::append((char *)&local_f8);
    std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    pFVar5 = fopen(local_d8._M_dataplus._M_p,"wb");
    pDVar9 = __dirp;
    if (pFVar5 != (FILE *)0x0) {
      if (local_60 == (_Rb_tree_node_base *)(local_78 + 8)) {
        _Var7 = _S_red;
      }
      else {
        _Var7 = _S_red;
        p_Var6 = local_60;
        do {
          if ((int)_Var7 < (int)p_Var6[1]._M_color) {
            _Var7 = p_Var6[1]._M_color;
          }
          for (p_Var8 = p_Var6[1]._M_parent; p_Var8 != p_Var6[1]._M_left;
              p_Var8 = (_Base_ptr)&p_Var8->_M_parent) {
            fprintf(pFVar5,"%d, %d, %lld\n",(ulong)p_Var6[1]._M_color,
                    (ulong)*(uint *)&p_Var6[1].field_0x4,*(undefined8 *)p_Var8);
          }
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
        } while (p_Var6 != (_Rb_tree_node_base *)(local_78 + 8));
      }
      fclose(pFVar5);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_b8._M_dataplus._M_p,
                 local_b8._M_dataplus._M_p + local_b8._M_string_length);
      std::__cxx11::string::append((char *)&local_f8);
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      pFVar5 = fopen(local_d8._M_dataplus._M_p,"wb");
      if (pFVar5 != (FILE *)0x0) {
        fprintf(pFVar5,"%d",(ulong)_Var7);
        fclose(pFVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     *)local_78);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        return;
      }
      goto LAB_00102ce1;
    }
  }
  psVar10 = (string *)pDVar9;
  doit((summaryindex *)&local_d8);
LAB_00102ce1:
  doit((summaryindex *)&local_d8);
  if ((string *)local_78._0_8_ != psVar10) {
    operator_delete((void *)local_78._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void doit(const std::string& subfolder)
{	
	std::string path = "work/" + subfolder;
	if (path.substr(path.length() - 1, 1) != "/") {
		path = path + "/";
	}

	std::vector<std::string> files;
	//std::map<int, std::vector<int>> summary_id_to_events;
	std::map<summary_keyz, std::vector<long long>> summary_id_file_id_to_offset;
	std::vector<int> event_ids;
	DIR* dir;
	struct dirent* ent;
	int file_index = 0;
	if ((dir = opendir(path.c_str())) != NULL) {
		while ((ent = readdir(dir)) != NULL) {
			std::string s = ent->d_name;
			if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
				std::string s2 = path + ent->d_name;
				files.push_back(s);
				indexevents(s2, event_ids, summary_id_file_id_to_offset, file_index);
				file_index++;
			}
		}
	}
	else {
		fprintf(stderr, "FATAL: Unable to open directory %s\n", path.c_str());
		exit(-1);
	}

	std::string filename =  path + "filelist.idx";
	FILE* fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "FATAL: cannot open %s\n",  filename.c_str());
		exit(EXIT_FAILURE);
	}
	auto iter = files.begin();
	while (iter != files.end()) {
		fprintf(fout, "%s\n", iter->c_str());
		iter++;
	}

	fclose(fout);


	int max_summary_id = 0;
	filename = path + "summaries.idx";
	fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "FATAL: cannot open %s\n", filename.c_str());
		exit(EXIT_FAILURE);
	}

	auto s_iter = summary_id_file_id_to_offset.begin();
	while (s_iter != summary_id_file_id_to_offset.end()) {
		if (s_iter->first.summary_id > max_summary_id) max_summary_id = s_iter->first.summary_id;
		auto v_iter = s_iter->second.begin();
		while (v_iter != s_iter->second.end()) {
			fprintf(fout, "%d, %d, %lld\n", s_iter->first.summary_id, s_iter->first.fileindex, *v_iter);
			v_iter++;
		}
		s_iter++;
	}
	fclose(fout);

	filename = path + "max_summary_id.idx";
	fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "FATAL: cannot open %s\n",  filename.c_str());
		exit(EXIT_FAILURE);
	}
	fprintf(fout, "%d", max_summary_id);
	fclose(fout);
	
}